

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostats.cpp
# Opt level: O1

summary<unsigned_int> * __thiscall
foxxll::stats_data::get_read_count_summary
          (summary<unsigned_int> *__return_storage_ptr__,stats_data *this)

{
  pointer pfVar1;
  pointer ppVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  double dVar4;
  uint *puVar5;
  undefined8 in_RAX;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  pointer ppVar9;
  uint uVar10;
  ulong uVar11;
  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
  __i;
  pointer ppVar12;
  file_stats_data *f;
  pointer pfVar13;
  uint *puVar14;
  undefined1 auVar15 [16];
  undefined8 local_38;
  
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values_per_device).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::reserve(&__return_storage_ptr__->values_per_device,
            ((long)(this->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->file_stats_data_list_).
                   super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  pfVar13 = (this->file_stats_data_list_).
            super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->file_stats_data_list_).
           super__Vector_base<foxxll::file_stats_data,_std::allocator<foxxll::file_stats_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pfVar13 != pfVar1) {
    do {
      local_38._0_4_ = pfVar13->device_id_;
      local_38._4_4_ = pfVar13->read_count_;
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<unsigned_int,unsigned_int>
                ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)&__return_storage_ptr__->values_per_device,(uint *)((long)&local_38 + 4),
                 (uint *)&local_38);
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 != pfVar1);
  }
  ppVar9 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != ppVar2) {
    uVar6 = (long)ppVar2 - (long)ppVar9 >> 3;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
              (ppVar9,ppVar2,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar2 - (long)ppVar9 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar9,ppVar2);
    }
    else {
      ppVar12 = ppVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_int>*,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<foxxll::stats_data::summary<unsigned_int>::summary<foxxll::stats_data::get_read_count_summary()const::__0>(std::vector<foxxll::file_stats_data,std::allocator<foxxll::file_stats_data>>const&,foxxll::stats_data::get_read_count_summary()const::__0_const&)::_lambda(std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>)_1_>>
                (ppVar9,ppVar12);
      if (ppVar12 != ppVar2) {
        puVar14 = &ppVar9[0x10].second;
        do {
          pVar3 = *ppVar12;
          uVar10 = pVar3.first;
          ppVar9 = ppVar12;
          puVar5 = puVar14;
          if (uVar10 < ppVar12[-1].first) {
            do {
              puVar8 = puVar5;
              *(pair<unsigned_int,_unsigned_int> *)(puVar8 + -1) =
                   *(pair<unsigned_int,_unsigned_int> *)(puVar8 + -3);
              puVar5 = puVar8 + -2;
            } while (uVar10 < puVar8[-5]);
            ppVar9 = (pointer)(puVar8 + -3);
          }
          ppVar9->first = uVar10;
          ppVar9->second = pVar3.second;
          ppVar12 = ppVar12 + 1;
          puVar14 = puVar14 + 2;
        } while (ppVar12 != ppVar2);
      }
    }
  }
  ppVar9 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->values_per_device).
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)ppVar2 - (long)ppVar9;
  if ((long)ppVar2 - (long)ppVar9 == 0) {
    __return_storage_ptr__->max = 0;
    __return_storage_ptr__->total = 0;
    __return_storage_ptr__->min = 0;
    __return_storage_ptr__->average = 0.0;
    __return_storage_ptr__->median = 0.0;
  }
  else {
    uVar6 = lVar7 >> 3;
    __return_storage_ptr__->min = ppVar9->first;
    __return_storage_ptr__->max = ppVar2[-1].first;
    uVar11 = uVar6 >> 1;
    if (((long)ppVar2 - (long)ppVar9 & 8U) == 0) {
      dVar4 = (double)(ppVar9[uVar11].first + ppVar9[uVar11 - 1].first) * 0.5;
    }
    else {
      dVar4 = (double)ppVar9[uVar11].first;
    }
    __return_storage_ptr__->median = dVar4;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + ppVar9->first;
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar2);
    auVar15._8_4_ = (int)(lVar7 >> 0x23);
    auVar15._0_8_ = uVar6;
    auVar15._12_4_ = 0x45300000;
    __return_storage_ptr__->total = uVar10;
    __return_storage_ptr__->average =
         (double)uVar10 /
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

stats_data::summary<unsigned> stats_data::get_read_count_summary() const
{
    return {
               file_stats_data_list_, [](const file_stats_data& fsd) {
                   return fsd.get_read_count();
               }
    };
}